

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.h
# Opt level: O1

ExpectedRef<const_std::string,_std::string> * __thiscall
yaml::Value::getString_abi_cxx11_
          (ExpectedRef<const_std::string,_std::string> *__return_storage_ptr__,Value *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  size_type local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  _Alloc_hider local_28;
  size_type sStack_20;
  
  if (this->type_ == String) {
    (__return_storage_ptr__->field_0).value_._M_data = &this->string_;
    __return_storage_ptr__->has_value_ = true;
  }
  else {
    local_58 = &local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Value is not of String type","");
    if (local_58 == &local_48) {
      sStack_20 = local_48._M_string_length;
      local_48.field_2._M_allocated_capacity =
           (size_type)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28
      ;
    }
    else {
      local_48.field_2._M_allocated_capacity = (size_type)local_58;
    }
    local_28._M_p._1_7_ = local_48._M_dataplus._M_p._1_7_;
    local_28._M_p._0_1_ = local_48._M_dataplus._M_p._0_1_;
    paVar1 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_0 = paVar1;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_48.field_2._M_allocated_capacity ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28) {
      paVar1->_M_allocated_capacity = (size_type)local_28._M_p;
      *(size_type *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) = sStack_20
      ;
    }
    else {
      (__return_storage_ptr__->field_0).value_._M_data =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           local_48.field_2._M_allocated_capacity;
      (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
           (size_type)local_28._M_p;
    }
    (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_50;
    __return_storage_ptr__->has_value_ = false;
  }
  return __return_storage_ptr__;
}

Assistant:

ExpectedRef<const std::string, std::string> getString() const {
		if (type_ != Type::String)
			return Unexpected<std::string>("Value is not of String type");
		return std::cref(string_);
	}